

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_fcadd_d_aarch64(void *vd,void *vn,void *vm,void *vg,void *vs,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  int32_t sign;
  float64 a;
  float64 fVar3;
  uint64_t *puVar4;
  float64 fVar5;
  float64 fVar6;
  float64 e3;
  float64 e2;
  float64 e1;
  float64 e0;
  uint64_t pg;
  float64 neg_real;
  float64 neg_imag;
  uint64_t *g;
  intptr_t i;
  intptr_t j;
  uint32_t desc_local;
  void *vs_local;
  void *vg_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  g = (uint64_t *)simd_oprsz(desc);
  sign = simd_data(desc);
  a = float64_set_sign(0,sign);
  fVar3 = float64_chs(a);
  do {
    uVar1 = *(ulong *)((long)vg + ((long)g + -1 >> 6) * 8);
    do {
      puVar4 = g + -1;
      g = g + -2;
      fVar6 = *(float64 *)((long)vn + (long)puVar4);
      uVar2 = *(ulong *)((long)vm + (long)g);
      if ((uVar1 >> ((byte)g & 0x3f) & 1) != 0) {
        fVar5 = float64_add_aarch64(*(float64 *)((long)vn + (long)g),
                                    *(ulong *)((long)vm + (long)puVar4) ^ fVar3,(float_status *)vs);
        *(float64 *)((long)vd + (long)g) = fVar5;
      }
      if ((uVar1 >> ((byte)puVar4 & 0x3f) & 1) != 0) {
        fVar6 = float64_add_aarch64(fVar6,uVar2 ^ a,(float_status *)vs);
        *(float64 *)((long)vd + (long)puVar4) = fVar6;
      }
    } while (((ulong)g & 0x3f) != 0);
  } while (g != (uint64_t *)0x0);
  return;
}

Assistant:

void HELPER(sve_fcadd_d)(void *vd, void *vn, void *vm, void *vg,
                         void *vs, uint32_t desc)
{
    intptr_t j, i = simd_oprsz(desc);
    uint64_t *g = vg;
    float64 neg_imag = float64_set_sign(0, simd_data(desc));
    float64 neg_real = float64_chs(neg_imag);

    do {
        uint64_t pg = g[(i - 1) >> 6];
        do {
            float64 e0, e1, e2, e3;

            /* I holds the real index; J holds the imag index.  */
            j = i - sizeof(float64);
            i -= 2 * sizeof(float64);

            e0 = *(float64 *)((char *)vn + H1_2(i));
            e1 = *(float64 *)((char *)vm + H1_2(j)) ^ neg_real;
            e2 = *(float64 *)((char *)vn + H1_2(j));
            e3 = *(float64 *)((char *)vm + H1_2(i)) ^ neg_imag;

            if (likely((pg >> (i & 63)) & 1)) {
                *(float64 *)((char *)vd + H1_2(i)) = float64_add(e0, e1, vs);
            }
            if (likely((pg >> (j & 63)) & 1)) {
                *(float64 *)((char *)vd + H1_2(j)) = float64_add(e2, e3, vs);
            }
        } while (i & 63);
    } while (i != 0);
}